

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Expression * __thiscall wasm::Builder::dropIfConcretelyTyped(Builder *this,Expression *curr)

{
  bool bVar1;
  Expression *curr_local;
  Builder *this_local;
  
  bVar1 = wasm::Type::isConcrete(&curr->type);
  this_local = (Builder *)curr;
  if (bVar1) {
    this_local = (Builder *)makeDrop(this,curr);
  }
  return (Expression *)this_local;
}

Assistant:

Expression* dropIfConcretelyTyped(Expression* curr) {
    if (!curr->type.isConcrete()) {
      return curr;
    }
    return makeDrop(curr);
  }